

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O2

void embree::OBJMaterial__preprocess
               (ISPCOBJMaterial *material,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,
               Medium *medium)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  fVar5 = material->d;
  if (material->map_d != (Texture *)0x0) {
    fVar4 = getTextureTexel1f(material->map_d,dg->u,dg->v);
    fVar5 = fVar5 * fVar4;
  }
  uVar3 = *(undefined8 *)((long)&(material->Ka).field_0 + 8);
  *(undefined8 *)&(brdf->Ka).field_0 = *(undefined8 *)&(material->Ka).field_0;
  *(undefined8 *)((long)&(brdf->Ka).field_0 + 8) = uVar3;
  fVar4 = (material->Kd).field_0.m128[1];
  fVar1 = (material->Kd).field_0.m128[2];
  fVar2 = (material->Kd).field_0.m128[3];
  (brdf->Kd).field_0.m128[0] = (material->Kd).field_0.m128[0] * fVar5;
  (brdf->Kd).field_0.m128[1] = fVar4 * fVar5;
  (brdf->Kd).field_0.m128[2] = fVar1 * fVar5;
  (brdf->Kd).field_0.m128[3] = fVar2 * fVar5;
  if (material->map_Kd != (Texture *)0x0) {
    getTextureTexel3f((Texture *)&stack0xffffffffffffffd8,dg->u,dg->v);
    fVar4 = (brdf->Kd).field_0.m128[1];
    fVar1 = (brdf->Kd).field_0.m128[2];
    fVar2 = (brdf->Kd).field_0.m128[3];
    (brdf->Kd).field_0.m128[0] = (brdf->Kd).field_0.m128[0] * local_28;
    (brdf->Kd).field_0.m128[1] = fVar4 * fStack_24;
    (brdf->Kd).field_0.m128[2] = fVar1 * fStack_20;
    (brdf->Kd).field_0.m128[3] = fVar2 * fStack_1c;
  }
  fVar4 = (material->Ks).field_0.m128[1];
  fVar1 = (material->Ks).field_0.m128[2];
  fVar2 = (material->Ks).field_0.m128[3];
  (brdf->Ks).field_0.m128[0] = fVar5 * (material->Ks).field_0.m128[0];
  (brdf->Ks).field_0.m128[1] = fVar5 * fVar4;
  (brdf->Ks).field_0.m128[2] = fVar5 * fVar1;
  (brdf->Ks).field_0.m128[3] = fVar5 * fVar2;
  brdf->Ns = material->Ns;
  fVar5 = 1.0 - fVar5;
  fVar4 = (material->Kt).field_0.m128[1];
  fVar1 = (material->Kt).field_0.m128[2];
  fVar2 = (material->Kt).field_0.m128[3];
  (brdf->Kt).field_0.m128[0] = fVar5 * (material->Kt).field_0.m128[0];
  (brdf->Kt).field_0.m128[1] = fVar5 * fVar4;
  (brdf->Kt).field_0.m128[2] = fVar5 * fVar1;
  (brdf->Kt).field_0.m128[3] = fVar5 * fVar2;
  brdf->Ni = material->Ni;
  return;
}

Assistant:

void OBJMaterial__preprocess(ISPCOBJMaterial* material, BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Medium& medium)
{
    float d = material->d;
    if (material->map_d) d *= getTextureTexel1f(material->map_d,dg.u,dg.v);
    brdf.Ka = Vec3fa(material->Ka);
    //if (material->map_Ka) { brdf.Ka *= material->map_Ka->get(dg.st); }
    brdf.Kd = d * Vec3fa(material->Kd);
    if (material->map_Kd) brdf.Kd = brdf.Kd * getTextureTexel3f(material->map_Kd,dg.u,dg.v);
    brdf.Ks = d * Vec3fa(material->Ks);
    //if (material->map_Ks) brdf.Ks *= material->map_Ks->get(dg.st);
    brdf.Ns = material->Ns;
    //if (material->map_Ns) { brdf.Ns *= material->map_Ns.get(dg.st); }
    brdf.Kt = (1.0f-d)*Vec3fa(material->Kt);
    brdf.Ni = material->Ni;
}